

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

int SUNQRsol(int n,sunrealtype **h,sunrealtype *q,sunrealtype *b)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  sunrealtype sVar12;
  
  if (0 < n) {
    sVar12 = *b;
    lVar8 = 0;
    do {
      pdVar2 = (double *)((long)q + lVar8 * 2);
      dVar4 = *pdVar2;
      dVar5 = pdVar2[1];
      dVar3 = *(double *)((long)b + lVar8 + 8);
      dVar11 = sVar12 * dVar4;
      sVar12 = sVar12 * dVar5 + dVar4 * dVar3;
      *(double *)((long)b + lVar8) = dVar11 + -dVar5 * dVar3;
      ((double *)((long)b + lVar8))[1] = sVar12;
      lVar8 = lVar8 + 8;
    } while ((ulong)(uint)n * 8 - lVar8 != 0);
    if (0 < n) {
      uVar6 = (ulong)(n - 1);
      uVar7 = (ulong)(uint)n;
      do {
        dVar3 = h[uVar7 - 1][uVar7 - 1];
        if ((dVar3 == 0.0) && (!NAN(dVar3))) {
          return (int)uVar7;
        }
        uVar1 = uVar7 - 1;
        b[uVar1] = b[uVar1] / dVar3;
        if (uVar7 < 2) {
          return 0;
        }
        uVar9 = 0;
        do {
          b[uVar9] = b[uVar9] - b[uVar1] * h[uVar9][uVar1];
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
        uVar6 = uVar6 - 1;
        bVar10 = 1 < uVar7;
        uVar7 = uVar1;
      } while (bVar10);
      return 0;
    }
  }
  return 0;
}

Assistant:

int SUNQRsol(int n, sunrealtype** h, sunrealtype* q, sunrealtype* b)
{
  sunrealtype c, s, temp1, temp2;
  int i, k, q_ptr, code = 0;

  /* Compute Q*b */

  for (k = 0; k < n; k++)
  {
    q_ptr    = 2 * k;
    c        = q[q_ptr];
    s        = q[q_ptr + 1];
    temp1    = b[k];
    temp2    = b[k + 1];
    b[k]     = c * temp1 - s * temp2;
    b[k + 1] = s * temp1 + c * temp2;
  }

  /* Solve  R*x = Q*b */

  for (k = n - 1; k >= 0; k--)
  {
    if (h[k][k] == ZERO)
    {
      code = k + 1;
      break;
    }
    b[k] /= h[k][k];
    for (i = 0; i < k; i++) { b[i] -= b[k] * h[i][k]; }
  }

  return (code);
}